

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_decrypt.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *__format;
  bool bVar5;
  int c;
  mbedtls_pk_context pk;
  size_t olen;
  mbedtls_ctr_drbg_context ctr_drbg;
  uchar buf [512];
  uchar result [1024];
  mbedtls_entropy_context entropy;
  
  olen = 0;
  mbedtls_pk_init(&pk);
  mbedtls_entropy_init(&entropy);
  mbedtls_ctr_drbg_init(&ctr_drbg);
  memset(result,0,0x400);
  if (argc == 2) {
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    iVar1 = mbedtls_ctr_drbg_seed
                      (&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)"mbedtls_pk_decrypt",0x12);
    if (iVar1 == 0) {
      printf("\n  . Reading private key from \'%s\'",argv[1]);
      fflush(_stdout);
      iVar1 = mbedtls_pk_parse_keyfile(&pk,argv[1],anon_var_dwarf_1fbb7 + 9);
      if (iVar1 == 0) {
        __stream = fopen("result-enc.txt","rb");
        if (__stream == (FILE *)0x0) {
          printf("\n  ! Could not open %s\n\n","result-enc.txt");
          goto LAB_0010c3cf;
        }
        uVar4 = 0;
        iVar1 = __isoc99_fscanf(__stream,"%02X",&c);
        if (0 < iVar1) {
          uVar3 = 0;
          do {
            uVar4 = uVar3 + 1;
            buf[uVar3] = (uchar)c;
            iVar1 = __isoc99_fscanf(__stream,"%02X",&c);
            if (iVar1 < 1) break;
            bVar5 = uVar3 < 0x1ff;
            uVar3 = uVar4;
          } while (bVar5);
        }
        fclose(__stream);
        iVar2 = 0;
        printf("\n  . Decrypting the encrypted data");
        fflush(_stdout);
        iVar1 = mbedtls_pk_decrypt(&pk,buf,uVar4,result,&olen,0x400,mbedtls_ctr_drbg_random,
                                   &ctr_drbg);
        if (iVar1 == 0) {
          puts("\n  . OK\n");
          printf("The decrypted result is: \'%s\'\n\n",result);
          bVar5 = true;
          iVar1 = 0;
          goto LAB_0010c426;
        }
        uVar4 = (ulong)(uint)-iVar1;
        __format = " failed\n  ! mbedtls_pk_decrypt returned -0x%04x\n";
      }
      else {
        uVar4 = (ulong)(uint)-iVar1;
        __format = " failed\n  ! mbedtls_pk_parse_keyfile returned -0x%04x\n";
      }
    }
    else {
      uVar4 = (ulong)(uint)-iVar1;
      __format = " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n";
    }
    bVar5 = false;
    printf(__format,uVar4);
    iVar2 = 1;
  }
  else {
    puts("usage: mbedtls_pk_decrypt <key_file>");
LAB_0010c3cf:
    bVar5 = false;
    iVar2 = 1;
    iVar1 = 1;
  }
LAB_0010c426:
  mbedtls_pk_free(&pk);
  mbedtls_entropy_free(&entropy);
  mbedtls_ctr_drbg_free(&ctr_drbg);
  if (!bVar5) {
    mbedtls_strerror(iVar1,(char *)buf,0x200);
    printf("  !  Last error was: %s\n",buf);
  }
  return iVar2;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret = 1, c;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    size_t i, olen = 0;
    mbedtls_pk_context pk;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char result[1024];
    unsigned char buf[512];
    const char *pers = "mbedtls_pk_decrypt";
    ((void) argv);

    mbedtls_pk_init( &pk );
    mbedtls_entropy_init( &entropy );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    memset(result, 0, sizeof( result ) );

    if( argc != 2 )
    {
        mbedtls_printf( "usage: mbedtls_pk_decrypt <key_file>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func,
                                       &entropy, (const unsigned char *) pers,
                                       strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n",
                        -ret );
        goto exit;
    }

    mbedtls_printf( "\n  . Reading private key from '%s'", argv[1] );
    fflush( stdout );

    if( ( ret = mbedtls_pk_parse_keyfile( &pk, argv[1], "" ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_parse_keyfile returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * Extract the RSA encrypted value from the text file
     */
    if( ( f = fopen( "result-enc.txt", "rb" ) ) == NULL )
    {
        mbedtls_printf( "\n  ! Could not open %s\n\n", "result-enc.txt" );
        ret = 1;
        goto exit;
    }

    i = 0;
    while( fscanf( f, "%02X", &c ) > 0 &&
           i < (int) sizeof( buf ) )
    {
        buf[i++] = (unsigned char) c;
    }

    fclose( f );

    /*
     * Decrypt the encrypted RSA data and print the result.
     */
    mbedtls_printf( "\n  . Decrypting the encrypted data" );
    fflush( stdout );

    if( ( ret = mbedtls_pk_decrypt( &pk, buf, i, result, &olen, sizeof(result),
                            mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_decrypt returned -0x%04x\n",
                        -ret );
        goto exit;
    }

    mbedtls_printf( "\n  . OK\n\n" );

    mbedtls_printf( "The decrypted result is: '%s'\n\n", result );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    mbedtls_pk_free( &pk );
    mbedtls_entropy_free( &entropy );
    mbedtls_ctr_drbg_free( &ctr_drbg );

#if defined(MBEDTLS_ERROR_C)
    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
        mbedtls_strerror( ret, (char *) buf, sizeof( buf ) );
        mbedtls_printf( "  !  Last error was: %s\n", buf );
    }
#endif

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}